

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

uECC_word_t regularize_k(uECC_word_t *k,uECC_word_t *k0,uECC_word_t *k1,uECC_Curve curve)

{
  ulong uVar1;
  uECC_word_t uVar2;
  char cVar3;
  uint uVar4;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar5;
  
  uVar6 = (uint)curve->num_n_bits;
  iVar5 = uVar6 + 0x7e;
  if (-1 < (int)(uVar6 + 0x3f)) {
    iVar5 = uVar6 + 0x3f;
  }
  uVar4 = iVar5 >> 6;
  cVar3 = (char)uVar4;
  if ('\0' < cVar3) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar1 = k[uVar8];
      uVar10 = uVar1 + uVar7 + curve->n[uVar8];
      uVar9 = (ulong)(uVar10 < uVar1);
      if (uVar10 == uVar1) {
        uVar9 = uVar7;
      }
      k0[uVar8] = uVar10;
      uVar8 = uVar8 + 1;
      uVar7 = uVar9;
    } while ((uVar4 & 0x7f) != uVar8);
    uVar2 = 1;
    if (uVar9 != 0) goto LAB_0010a980;
  }
  if ((int)uVar6 < cVar3 * 0x40) {
    uVar2 = (uECC_word_t)((k0[(int)uVar6 >> 6] >> ((ulong)uVar6 & 0x3f) & 1) != 0);
  }
  else {
    uVar2 = 0;
  }
LAB_0010a980:
  if ('\0' < cVar3) {
    uVar8 = 0;
    uVar7 = 0;
    do {
      uVar1 = k0[uVar8];
      uVar9 = uVar1 + uVar7 + curve->n[uVar8];
      if (uVar9 != uVar1) {
        uVar7 = (ulong)(uVar9 < uVar1);
      }
      k1[uVar8] = uVar9;
      uVar8 = uVar8 + 1;
    } while ((uVar4 & 0x7f) != uVar8);
  }
  return uVar2;
}

Assistant:

static uECC_word_t regularize_k(const uECC_word_t * const k,
                                uECC_word_t *k0,
                                uECC_word_t *k1,
                                uECC_Curve curve) {
    wordcount_t num_n_words = BITS_TO_WORDS(curve->num_n_bits);
    bitcount_t num_n_bits = curve->num_n_bits;
    uECC_word_t carry = uECC_vli_add(k0, k, curve->n, num_n_words) ||
        (num_n_bits < ((bitcount_t)num_n_words * uECC_WORD_SIZE * 8) &&
         uECC_vli_testBit(k0, num_n_bits));
    uECC_vli_add(k1, k0, curve->n, num_n_words);
    return carry;
}